

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getpass.c
# Opt level: O3

char * getpass_r(char *prompt,char *password,size_t buflen)

{
  int __fd;
  ssize_t sVar1;
  char *pcVar2;
  
  __fd = open64("/dev/tty",0);
  if (__fd == -1) {
    __fd = 0;
  }
  tcgetattr(__fd,(termios *)ttyecho_withecho);
  ttyecho_noecho._0_8_ = ttyecho_withecho._0_8_;
  ttyecho_noecho._16_8_ = ttyecho_withecho._16_8_;
  ttyecho_noecho._24_8_ = ttyecho_withecho._24_8_;
  ttyecho_noecho._32_8_ = ttyecho_withecho._32_8_;
  ttyecho_noecho._40_4_ = ttyecho_withecho._40_4_;
  ttyecho_noecho._44_4_ = ttyecho_withecho._44_4_;
  ttyecho_noecho._48_4_ = ttyecho_withecho._48_4_;
  ttyecho_noecho._52_8_ = ttyecho_withecho._52_8_;
  ttyecho_noecho._8_8_ = ttyecho_withecho._8_8_ & 0xfffffff7ffffffff;
  tcsetattr(__fd,0,(termios *)ttyecho_noecho);
  fputs(prompt,_stderr);
  sVar1 = read(__fd,password,buflen);
  pcVar2 = password + sVar1 + -1;
  if (sVar1 < 1) {
    pcVar2 = password;
  }
  *pcVar2 = '\0';
  fputs("\n",_stderr);
  tcsetattr(__fd,2,(termios *)ttyecho_withecho);
  if (__fd != 0) {
    close(__fd);
  }
  return password;
}

Assistant:

char *getpass_r(const char *prompt, /* prompt to display */
                char *password,     /* buffer to store password in */
                size_t buflen)      /* size of buffer to store password in */
{
  ssize_t nread;
  bool disabled;
  int fd = open("/dev/tty", O_RDONLY);
  if(-1 == fd)
    fd = STDIN_FILENO; /* use stdin if the tty couldn't be used */

  disabled = ttyecho(FALSE, fd); /* disable terminal echo */

  fputs(prompt, stderr);
  nread = read(fd, password, buflen);
  if(nread > 0)
    password[--nread] = '\0'; /* null-terminate where enter is stored */
  else
    password[0] = '\0'; /* got nothing */

  if(disabled) {
    /* if echo actually was disabled, add a newline */
    fputs("\n", stderr);
    (void)ttyecho(TRUE, fd); /* enable echo */
  }

  if(STDIN_FILENO != fd)
    close(fd);

  return password; /* return pointer to buffer */
}